

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QList<QAccessibleInterface_*> * __thiscall
QAccessibleTable::selectedCells
          (QList<QAccessibleInterface_*> *__return_storage_ptr__,QAccessibleTable *this)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  int iVar3;
  QAbstractItemView *pQVar4;
  QItemSelectionModel *pQVar5;
  QListView *this_00;
  QHeaderView *pQVar6;
  QHeaderView *pQVar7;
  long lVar8;
  int iVar9;
  long in_FS_OFFSET;
  QAccessibleInterface *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAccessibleInterface **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  pQVar4 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar5 = QAbstractItemView::selectionModel(pQVar4);
  if (pQVar5 != (QItemSelectionModel *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    pQVar4 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject)
    ;
    QAbstractItemView::selectionModel(pQVar4);
    QItemSelectionModel::selectedIndexes();
    QList<QAccessibleInterface_*>::reserve(__return_storage_ptr__,-0x5555555555555556);
    lVar8 = 0;
    do {
      iVar9 = -1;
      if (((*(long *)(&DAT_aaaaaaaaaaaaaaba + lVar8) != 0) &&
          (-1 < *(int *)(&DAT_aaaaaaaaaaaaaaaa + lVar8))) &&
         (iVar3 = *(int *)(&DAT_aaaaaaaaaaaaaaae + lVar8), -1 < iVar3)) {
        if (this->m_role == List) {
          (**(code **)(*(long *)pQVar1 + 0x18))();
          QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
          this_00 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
          iVar2 = QListView::modelColumn(this_00);
          iVar9 = -1;
          if (iVar3 == iVar2) {
            iVar9 = *(int *)(&DAT_aaaaaaaaaaaaaaaa + lVar8);
          }
        }
        else {
          pQVar6 = verticalHeader(this);
          pQVar7 = horizontalHeader(this);
          iVar9 = *(int *)(&DAT_aaaaaaaaaaaaaaaa + lVar8);
          iVar3 = (**(code **)(*(long *)this + 0x58))(this);
          iVar9 = (uint)(pQVar6 != (QHeaderView *)0x0) + *(int *)(&DAT_aaaaaaaaaaaaaaae + lVar8) +
                  (iVar3 + (uint)(pQVar6 != (QHeaderView *)0x0)) *
                  ((iVar9 + 1) - (uint)(pQVar7 == (QHeaderView *)0x0));
        }
      }
      local_40 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,iVar9);
      QtPrivate::QPodArrayOps<QAccessibleInterface*>::emplace<QAccessibleInterface*&>
                ((QPodArrayOps<QAccessibleInterface*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_40);
      QList<QAccessibleInterface_*>::end(__return_storage_ptr__);
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != -0x10);
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QAccessibleInterface *> QAccessibleTable::selectedCells() const
{
    QList<QAccessibleInterface*> cells;
    if (!view()->selectionModel())
        return cells;
    const QModelIndexList selectedIndexes = view()->selectionModel()->selectedIndexes();
    cells.reserve(selectedIndexes.size());
    for (const QModelIndex &index : selectedIndexes)
        cells.append(child(logicalIndex(index)));
    return cells;
}